

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_dm.cxx
# Opt level: O0

void __thiscall xray_re::xr_dm::save_dm(xr_dm *this,xr_writer *w)

{
  size_t sVar1;
  xr_writer *w_local;
  xr_dm *this_local;
  
  xr_writer::w_sz(w,&this->m_shader);
  xr_writer::w_sz(w,&this->m_texture);
  xr_writer::w_u32(w,this->m_flags);
  xr_writer::w_float(w,this->m_min_scale);
  xr_writer::w_float(w,this->m_max_scale);
  sVar1 = xr_flexbuf::size(&(this->m_vb).super_xr_flexbuf);
  xr_writer::w_size_u32(w,sVar1);
  sVar1 = xr_flexbuf::size(&(this->m_ib).super_xr_flexbuf);
  xr_writer::w_size_u32(w,sVar1);
  xr_vbuf::save_dm(&this->m_vb,w);
  xr_ibuf::save(&this->m_ib,w);
  return;
}

Assistant:

void xr_dm::save_dm(xr_writer& w) const
{
	w.w_sz(m_shader);
	w.w_sz(m_texture);
	w.w_u32(m_flags);
	w.w_float(m_min_scale);
	w.w_float(m_max_scale);
	w.w_size_u32(m_vb.size());
	w.w_size_u32(m_ib.size());
	m_vb.save_dm(w);
	m_ib.save(w);
}